

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O2

void XNVCTRLSetTargetAttribute
               (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
               int value)

{
  XExtDisplayInfo *info;
  undefined1 *puVar1;
  int target_id_local;
  int target_type_local;
  
  target_id_local = target_id;
  target_type_local = target_type;
  info = find_display(dpy);
  if ((info == (XExtDisplayInfo *)0x0) || (info->codes == (XExtCodes *)0x0)) {
    XMissingExtension(dpy,"NV-CONTROL");
    return;
  }
  XNVCTRLCheckTargetData(dpy,info,&target_type_local,&target_id_local);
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->lock_display)(dpy);
  }
  puVar1 = (undefined1 *)_XGetRequest(dpy,3,0x14);
  *puVar1 = (char)info->codes->major_opcode;
  puVar1[1] = 3;
  *(undefined2 *)(puVar1 + 6) = (undefined2)target_type_local;
  *(undefined2 *)(puVar1 + 4) = (undefined2)target_id_local;
  *(uint *)(puVar1 + 8) = display_mask;
  *(uint *)(puVar1 + 0xc) = attribute;
  *(int *)(puVar1 + 0x10) = value;
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->unlock_display)(dpy);
  }
  if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
    (*dpy->synchandler)(dpy);
    return;
  }
  return;
}

Assistant:

void XNVCTRLSetTargetAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetAttributeReq *req;

    XNVCTRLSimpleCheckExtension (dpy, info);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlSetAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->value = value;
    UnlockDisplay (dpy);
    SyncHandle ();
}